

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * ON_Font::GetManagedFont
                    (wchar_t *face_name,Weight font_weight,Style font_style,Stretch font_stretch,
                    bool bUnderlined,bool bStrikethrough,double linefeed_ratio,uint logfont_charset)

{
  ON_Font *pOVar1;
  double linefeed_ratio_local;
  bool bStrikethrough_local;
  bool bUnderlined_local;
  Stretch font_stretch_local;
  Style font_style_local;
  Weight font_weight_local;
  wchar_t *face_name_local;
  
  pOVar1 = GetManagedFont(0.0,face_name,font_weight,font_style,font_stretch,bUnderlined,
                          bStrikethrough,linefeed_ratio,logfont_charset);
  return pOVar1;
}

Assistant:

const ON_Font* ON_Font::GetManagedFont(
  const wchar_t* face_name,
  ON_Font::Weight font_weight,
  ON_Font::Style font_style,
  ON_Font::Stretch font_stretch,
  bool bUnderlined,
  bool bStrikethrough,
  double linefeed_ratio,
  unsigned int logfont_charset
)
{
  return ON_Font::GetManagedFont(
    0.0, // point_size
    face_name,
    font_weight,
    font_style,
    font_stretch,
    bUnderlined,
    bStrikethrough,
    linefeed_ratio,
    logfont_charset
  );
}